

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O1

void __thiscall wallet::PageHeader::Unserialize<AutoFile>(PageHeader *this,AutoFile *s)

{
  uint16_t *puVar1;
  uint uVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  runtime_error *this_00;
  size_t in_RCX;
  long in_FS_OFFSET;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  uint32_t obj;
  uint32_t local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  this->lsn_file = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  this->lsn_offset = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  this->page_num = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  this->prev_page = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  this->next_page = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x2,in_RCX);
  this->entries = (uint16_t)local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x2,in_RCX);
  this->hf_offset = (uint16_t)local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x1,in_RCX);
  this->level = (PageType)local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x1,in_RCX);
  this->type = (PageType)local_24;
  if (this->other_endian == true) {
    auVar28._0_4_ = this->lsn_file;
    auVar28._4_4_ = this->lsn_offset;
    auVar28._8_4_ = this->page_num;
    auVar28._12_4_ = this->prev_page;
    auVar30[1] = 0;
    auVar30[0] = (byte)auVar28._8_4_;
    auVar30[2] = (char)((uint)auVar28._8_4_ >> 8);
    auVar30[3] = 0;
    auVar30[4] = (char)((uint)auVar28._8_4_ >> 0x10);
    auVar30[5] = 0;
    auVar30[6] = (char)((uint)auVar28._8_4_ >> 0x18);
    auVar30[7] = 0;
    auVar30[8] = (char)auVar28._12_4_;
    auVar30[9] = 0;
    auVar30[10] = (char)((uint)auVar28._12_4_ >> 8);
    auVar30[0xb] = 0;
    auVar30[0xc] = (char)((uint)auVar28._12_4_ >> 0x10);
    auVar30[0xd] = 0;
    auVar30[0xe] = (char)((uint)auVar28._12_4_ >> 0x18);
    auVar30[0xf] = 0;
    auVar29 = pshuflw(auVar30,auVar30,0x1b);
    auVar30 = pshufhw(auVar29,auVar29,0x1b);
    auVar19[0xd] = 0;
    auVar19._0_13_ = auVar28._0_13_;
    auVar19[0xe] = (char)((uint)auVar28._4_4_ >> 0x18);
    auVar20[0xc] = (char)((uint)auVar28._4_4_ >> 0x10);
    auVar20._0_12_ = auVar28._0_12_;
    auVar20._13_2_ = auVar19._13_2_;
    auVar21[0xb] = 0;
    auVar21._0_11_ = auVar28._0_11_;
    auVar21._12_3_ = auVar20._12_3_;
    auVar22[10] = (char)((uint)auVar28._4_4_ >> 8);
    auVar22._0_10_ = auVar28._0_10_;
    auVar22._11_4_ = auVar21._11_4_;
    auVar23[9] = 0;
    auVar23._0_9_ = auVar28._0_9_;
    auVar23._10_5_ = auVar22._10_5_;
    auVar24[8] = (char)auVar28._4_4_;
    auVar24._0_8_ = auVar28._0_8_;
    auVar24._9_6_ = auVar23._9_6_;
    auVar25._7_8_ = 0;
    auVar25._0_7_ = auVar24._8_7_;
    auVar26._1_8_ = SUB158(auVar25 << 0x40,7);
    auVar26[0] = (char)((uint)auVar28._0_4_ >> 0x18);
    auVar26._9_6_ = 0;
    auVar27._1_10_ = SUB1510(auVar26 << 0x30,5);
    auVar27[0] = (char)((uint)auVar28._0_4_ >> 0x10);
    auVar27._11_4_ = 0;
    auVar29._3_12_ = SUB1512(auVar27 << 0x20,3);
    auVar29[2] = (char)((uint)auVar28._0_4_ >> 8);
    auVar29[0] = (byte)auVar28._0_4_;
    auVar29[1] = 0;
    auVar29[0xf] = 0;
    auVar28 = pshuflw(auVar29,auVar29,0x1b);
    auVar28 = pshufhw(auVar28,auVar28,0x1b);
    sVar3 = auVar28._0_2_;
    sVar4 = auVar28._2_2_;
    sVar5 = auVar28._4_2_;
    sVar6 = auVar28._6_2_;
    sVar7 = auVar28._8_2_;
    sVar8 = auVar28._10_2_;
    sVar9 = auVar28._12_2_;
    sVar10 = auVar28._14_2_;
    sVar11 = auVar30._0_2_;
    sVar12 = auVar30._2_2_;
    sVar13 = auVar30._4_2_;
    sVar14 = auVar30._6_2_;
    sVar15 = auVar30._8_2_;
    sVar16 = auVar30._10_2_;
    sVar17 = auVar30._12_2_;
    sVar18 = auVar30._14_2_;
    *(char *)&this->lsn_file = (0 < sVar3) * (sVar3 < 0x100) * auVar28[0] - (0xff < sVar3);
    *(char *)((long)&this->lsn_file + 1) =
         (0 < sVar4) * (sVar4 < 0x100) * auVar28[2] - (0xff < sVar4);
    *(char *)((long)&this->lsn_file + 2) =
         (0 < sVar5) * (sVar5 < 0x100) * auVar28[4] - (0xff < sVar5);
    *(char *)((long)&this->lsn_file + 3) =
         (0 < sVar6) * (sVar6 < 0x100) * auVar28[6] - (0xff < sVar6);
    *(char *)&this->lsn_offset = (0 < sVar7) * (sVar7 < 0x100) * auVar28[8] - (0xff < sVar7);
    *(char *)((long)&this->lsn_offset + 1) =
         (0 < sVar8) * (sVar8 < 0x100) * auVar28[10] - (0xff < sVar8);
    *(char *)((long)&this->lsn_offset + 2) =
         (0 < sVar9) * (sVar9 < 0x100) * auVar28[0xc] - (0xff < sVar9);
    *(char *)((long)&this->lsn_offset + 3) =
         (0 < sVar10) * (sVar10 < 0x100) * auVar28[0xe] - (0xff < sVar10);
    *(char *)&this->page_num = (0 < sVar11) * (sVar11 < 0x100) * auVar30[0] - (0xff < sVar11);
    *(char *)((long)&this->page_num + 1) =
         (0 < sVar12) * (sVar12 < 0x100) * auVar30[2] - (0xff < sVar12);
    *(char *)((long)&this->page_num + 2) =
         (0 < sVar13) * (sVar13 < 0x100) * auVar30[4] - (0xff < sVar13);
    *(char *)((long)&this->page_num + 3) =
         (0 < sVar14) * (sVar14 < 0x100) * auVar30[6] - (0xff < sVar14);
    *(char *)&this->prev_page = (0 < sVar15) * (sVar15 < 0x100) * auVar30[8] - (0xff < sVar15);
    *(char *)((long)&this->prev_page + 1) =
         (0 < sVar16) * (sVar16 < 0x100) * auVar30[10] - (0xff < sVar16);
    *(char *)((long)&this->prev_page + 2) =
         (0 < sVar17) * (sVar17 < 0x100) * auVar30[0xc] - (0xff < sVar17);
    *(char *)((long)&this->prev_page + 3) =
         (0 < sVar18) * (sVar18 < 0x100) * auVar30[0xe] - (0xff < sVar18);
    uVar2 = this->next_page;
    this->next_page =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    puVar1 = &this->entries;
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    puVar1 = &this->hf_offset;
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  }
  if (this->expected_page_num == this->page_num) {
    if ((this->level == '\0') != ((PageType)local_24 != OVERFLOW_DATA)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        return;
      }
      goto LAB_001e9a42;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Bad btree level");
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Page number mismatch");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_001e9a42:
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s)
    {
        s >> lsn_file;
        s >> lsn_offset;
        s >> page_num;
        s >> prev_page;
        s >> next_page;
        s >> entries;
        s >> hf_offset;
        s >> level;

        uint8_t uint8_type;
        s >> uint8_type;
        type = static_cast<PageType>(uint8_type);

        if (other_endian) {
            lsn_file = internal_bswap_32(lsn_file);
            lsn_offset = internal_bswap_32(lsn_offset);
            page_num = internal_bswap_32(page_num);
            prev_page = internal_bswap_32(prev_page);
            next_page = internal_bswap_32(next_page);
            entries = internal_bswap_16(entries);
            hf_offset = internal_bswap_16(hf_offset);
        }

        if (expected_page_num != page_num) {
            throw std::runtime_error("Page number mismatch");
        }
        if ((type != PageType::OVERFLOW_DATA && level < 1) || (type == PageType::OVERFLOW_DATA && level != 0)) {
            throw std::runtime_error("Bad btree level");
        }
    }